

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str.c
# Opt level: O2

void tc_ap_str_trim_tail_from_set(CuTest *tc)

{
  char *pcVar1;
  char buf_str [1024];
  
  pcVar1 = ap_str_trim_tail_from_set((char *)0x0," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x6c,"strings should be equal",(char *)0x0,pcVar1);
  pcVar1 = ap_str_trim_tail_from_set(""," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x6d,"strings should be equal","",pcVar1);
  buf_str[0] = ' ';
  buf_str[1] = '\0';
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x70,"strings should be equal","",pcVar1);
  buf_str._2_6_ = buf_str._2_6_ & 0xffffffffff00;
  buf_str[0] = ' ';
  buf_str[1] = ' ';
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x73,"strings should be equal","",pcVar1);
  builtin_strncpy(buf_str,"   ",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x76,"strings should be equal","",pcVar1);
  buf_str[0] = '\t';
  buf_str[1] = '\0';
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x79,"strings should be equal","",pcVar1);
  buf_str._2_6_ = buf_str._2_6_ & 0xffffffffff00;
  buf_str[0] = '\t';
  buf_str[1] = '\t';
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x7c,"strings should be equal","",pcVar1);
  builtin_strncpy(buf_str,"\t\t\t",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x7f,"strings should be equal","",pcVar1);
  buf_str._2_6_ = SUB86(buf_str._0_8_,2) & 0xffffffffff00;
  buf_str[0] = ' ';
  buf_str[1] = 'a';
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x82,"strings should be equal"," a",pcVar1);
  builtin_strncpy(buf_str,"  a",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x85,"strings should be equal","  a",pcVar1);
  buf_str._4_4_ = buf_str._4_4_ & 0xffffff00;
  builtin_strncpy(buf_str,"   a",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x88,"strings should be equal","   a",pcVar1);
  buf_str._2_6_ = SUB86(buf_str._0_8_,2) & 0xffffffffff00;
  buf_str[0] = '\t';
  buf_str[1] = 'a';
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x8b,"strings should be equal","\ta",pcVar1);
  builtin_strncpy(buf_str,"\t\ta",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x8e,"strings should be equal","\t\ta",pcVar1);
  buf_str._4_4_ = buf_str._4_4_ & 0xffffff00;
  builtin_strncpy(buf_str,"\t\t\ta",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x91,"strings should be equal","\t\t\ta",pcVar1);
  builtin_strncpy(buf_str," a ",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x94,"strings should be equal"," a",pcVar1);
  buf_str._2_6_ = SUB86(buf_str._0_8_,2) & 0xffffffffff00;
  buf_str[0] = 'a';
  buf_str[1] = ' ';
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x97,"strings should be equal","a",pcVar1);
  builtin_strncpy(buf_str,"a  ",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x9a,"strings should be equal","a",pcVar1);
  buf_str._4_4_ = buf_str._4_4_ & 0xffffff00;
  builtin_strncpy(buf_str,"a   ",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x9d,"strings should be equal","a",pcVar1);
  buf_str._2_6_ = SUB86(buf_str._0_8_,2) & 0xffffffffff00;
  buf_str[0] = 'a';
  buf_str[1] = '\t';
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xa0,"strings should be equal","a",pcVar1);
  builtin_strncpy(buf_str,"a\t\t",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xa3,"strings should be equal","a",pcVar1);
  buf_str._4_4_ = buf_str._4_4_ & 0xffffff00;
  builtin_strncpy(buf_str,"a\t\t\t",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xa6,"strings should be equal","a",pcVar1);
  builtin_strncpy(buf_str," a\t",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xa9,"strings should be equal"," a",pcVar1);
  buf_str._4_4_ = buf_str._4_4_ & 0xffffff00;
  builtin_strncpy(buf_str," a \t",4);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xac,"strings should be equal"," a",pcVar1);
  builtin_strncpy(buf_str," \t \t \ta \t \t \t \t",0x10);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xaf,"strings should be equal"," \t \t \ta",pcVar1);
  builtin_strncpy(buf_str,"aaa bbb ccc",0xc);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xb2,"strings should be equal","aaa bbb ccc",pcVar1);
  builtin_strncpy(buf_str,"         aaa bbb ccc",0x15);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xb5,"strings should be equal","         aaa bbb ccc",pcVar1);
  builtin_strncpy(buf_str,"  \t\t  \t  \taaa bbb ccc",0x16);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xb8,"strings should be equal","  \t\t  \t  \taaa bbb ccc",pcVar1);
  builtin_strncpy(buf_str,"  \t\t  \t  \taaa bbb ccc \t \t \t   ",0x1f);
  pcVar1 = ap_str_trim_tail_from_set(buf_str," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0xbb,"strings should be equal","  \t\t  \t  \taaa bbb ccc",pcVar1);
  return;
}

Assistant:

static void tc_ap_str_trim_tail_from_set (CuTest* tc)
{
	char	buf_str[1024];

	CuAssertStrEquals_Msg (tc, "strings should be equal", NULL,							ap_str_trim_tail_from_set (NULL, " \t"));
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set ("", " \t"));

	strcpy (buf_str, " ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "  ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "   ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "\t\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, " a");
	CuAssertStrEquals_Msg (tc, "strings should be equal", " a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "  a");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "  a",						ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "   a");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "   a",						ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "\ta");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "\ta",						ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "\t\ta");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "\t\ta",						ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "\t\t\ta");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "\t\t\ta",					ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, " a ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", " a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "a ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "a  ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "a   ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "a\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "a\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "a\t\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, " a\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", " a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, " a \t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", " a",							ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, " \t \t \ta \t \t \t \t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", " \t \t \ta",					ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "aaa bbb ccc");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "aaa bbb ccc",				ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "         aaa bbb ccc");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "         aaa bbb ccc",		ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "  \t\t  \t  \taaa bbb ccc");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "  \t\t  \t  \taaa bbb ccc",	ap_str_trim_tail_from_set (buf_str, " \t"));

	strcpy (buf_str, "  \t\t  \t  \taaa bbb ccc \t \t \t   ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "  \t\t  \t  \taaa bbb ccc",	ap_str_trim_tail_from_set (buf_str, " \t"));
}